

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O0

string_t * cfgfile::to_cfgfile_format<cfgfile::string_trait_t>(string_t *what)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string *in_RSI;
  string_t *in_RDI;
  char_t *ch;
  const_iterator __end0;
  const_iterator __begin0;
  string_t *__range3;
  string_t *result;
  string *in_stack_fffffffffffffde8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf0;
  string_t *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string local_1c8 [32];
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  reference local_68;
  undefined8 local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string *local_50;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30 [32];
  string *local_10;
  
  __s = in_RDI;
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::find
                      ((char)local_10,
                       (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_begin_tag);
    if ((((((lVar3 == -1) &&
           (lVar3 = std::__cxx11::string::find
                              ((char)local_10,
                               (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_end_tag),
           lVar3 == -1)) &&
          (lVar3 = std::__cxx11::string::find
                             ((char)local_10,
                              (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_quotes),
          lVar3 == -1)) &&
         ((lVar3 = std::__cxx11::string::find
                             ((char)local_10,
                              (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_carriage_return)
          , lVar3 == -1 &&
          (lVar3 = std::__cxx11::string::find
                             ((char)local_10,
                              (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_line_feed),
          lVar3 == -1)))) &&
        ((lVar3 = std::__cxx11::string::find
                            ((char)local_10,
                             (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_tab), lVar3 == -1
         && ((lVar3 = std::__cxx11::string::find
                                ((char)local_10,
                                 (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_back_slash),
             lVar3 == -1 &&
             (lVar3 = std::__cxx11::string::find
                                ((char)local_10,
                                 (ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_space),
             lVar3 == -1)))))) &&
       ((lVar3 = std::__cxx11::string::find(local_10,0x173390), lVar3 == -1 &&
        ((lVar3 = std::__cxx11::string::find(local_10,0x1733b8), lVar3 == -1 &&
         (lVar3 = std::__cxx11::string::find(local_10,0x1733e0), lVar3 == -1)))))) {
      std::__cxx11::string::string((string *)in_RDI,local_10);
    }
    else {
      local_45 = 0;
      std::__cxx11::string::string((string *)in_RDI);
      std::__cxx11::string::push_back((char)in_RDI);
      local_50 = local_10;
      local_58._M_current = (char *)std::__cxx11::string::begin();
      local_60 = std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffdf0,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffde8), bVar1) {
        local_68 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_58);
        if (*local_68 == const_t<cfgfile::string_trait_t>::c_quotes) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
          string_trait_t::from_ascii(in_stack_fffffffffffffde8);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_88);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
        else if (*local_68 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
          string_trait_t::from_ascii(in_stack_fffffffffffffde8);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_d0);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator(&local_f1);
        }
        else if (*local_68 == const_t<cfgfile::string_trait_t>::c_line_feed) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
          string_trait_t::from_ascii(in_stack_fffffffffffffde8);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_118);
          std::__cxx11::string::~string(local_138);
          std::allocator<char>::~allocator(&local_139);
        }
        else if (*local_68 == const_t<cfgfile::string_trait_t>::c_tab) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
          string_trait_t::from_ascii(in_stack_fffffffffffffde8);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_160);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator(&local_181);
        }
        else if (*local_68 == const_t<cfgfile::string_trait_t>::c_back_slash) {
          in_stack_fffffffffffffdf0 =
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stack0xfffffffffffffe37;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
          string_trait_t::from_ascii(in_stack_fffffffffffffde8);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
        }
        else {
          std::__cxx11::string::push_back((char)in_RDI);
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_58);
      }
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,(char *)__s,(allocator<char> *)in_RDI);
    string_trait_t::from_ascii(in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return __s;
}

Assistant:

static inline typename Trait::string_t to_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.empty() )
		return Trait::from_ascii( "\"\"" );

	if( what.find( const_t< Trait >::c_begin_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_end_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_quotes ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_carriage_return ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_line_feed ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_tab )  == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_back_slash ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_space ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_one_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_start_multi_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_finish_multi_line_comment ) == Trait::string_t::npos )
			return what;
	else
	{
		typename Trait::string_t result;

		result.push_back( const_t< Trait >::c_quotes );

		for( const typename Trait::char_t & ch : what )
		{
			if( ch == const_t< Trait >::c_quotes )
				result.append( Trait::from_ascii( "\\\"" ) );
			else if( ch == const_t< Trait >::c_carriage_return )
				result.append( Trait::from_ascii( "\\n" ) );
			else if( ch == const_t< Trait >::c_line_feed )
				result.append( Trait::from_ascii( "\\r" ) );
			else if( ch == const_t< Trait >::c_tab )
				result.append( Trait::from_ascii( "\\t" ) );
			else if( ch == const_t< Trait >::c_back_slash )
				result.append( Trait::from_ascii( "\\\\" ) );
			else
				result.push_back( ch );
		}

		result.push_back( const_t< Trait >::c_quotes );

		return result;
	}
}